

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_wiznet(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  pointer pwVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  pointer pwVar8;
  size_t sVar9;
  char *txt;
  int iVar10;
  double dVar11;
  char buf [4608];
  char local_1238 [4616];
  
  if (*argument == '\0') {
    if ((ch->wiznet[0] & 1) == 0) {
      send_to_char("Welcome to Wiznet!\n\r",ch);
      uVar7 = ch->wiznet[0] | 1;
    }
    else {
      send_to_char("Signing off of Wiznet.\n\r",ch);
      uVar7 = ch->wiznet[0] & 0xfffffffffffffffe;
    }
    ch->wiznet[0] = uVar7;
  }
  else {
    bVar3 = str_prefix(argument,"on");
    if (bVar3) {
      bVar3 = str_prefix(argument,"off");
      if (bVar3) {
        bVar3 = str_prefix(argument,"status");
        if (bVar3) {
          bVar3 = str_prefix(argument,"show");
          if (bVar3) {
            lVar6 = wiznet_lookup(argument);
            iVar10 = (int)lVar6;
            if (iVar10 != -1) {
              iVar4 = get_trust(ch);
              if (wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>._M_impl
                  .super__Vector_impl_data._M_start[iVar10].level <= iVar4) {
                iVar4 = wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar10].flag;
                iVar5 = iVar4 + 0x1f;
                if (-1 < iVar4) {
                  iVar5 = iVar4;
                }
                uVar7 = ch->wiznet[iVar5 >> 5];
                dVar11 = ldexp(1.0,iVar4 % 0x20);
                if ((uVar7 & (long)dVar11) != 0) {
                  sprintf(local_1238,"You will no longer see %s on wiznet.\n\r",
                          wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar10].name);
                  send_to_char(local_1238,ch);
                  dVar11 = ldexp(1.0,wiznet_table.
                                     super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                                     _M_impl.super__Vector_impl_data._M_start[iVar10].flag % 0x20);
                  iVar10 = wiznet_table.
                           super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar10].flag;
                  iVar4 = iVar10 + 0x1f;
                  if (-1 < iVar10) {
                    iVar4 = iVar10;
                  }
                  ch->wiznet[iVar4 >> 5] = ch->wiznet[iVar4 >> 5] & ~(long)dVar11;
                  return;
                }
                sprintf(local_1238,"You will now see %s on wiznet.\n\r",
                        wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar10].name);
                send_to_char(local_1238,ch);
                dVar11 = ldexp(1.0,wiznet_table.
                                   super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                                   _M_impl.super__Vector_impl_data._M_start[iVar10].flag % 0x20);
                iVar10 = wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar10].flag;
                iVar4 = iVar10 + 0x1f;
                if (-1 < iVar10) {
                  iVar4 = iVar10;
                }
                ch->wiznet[iVar4 >> 5] = ch->wiznet[iVar4 >> 5] | (long)dVar11;
                return;
              }
            }
            send_to_char("No such option.\n\r",ch);
            return;
          }
          local_1238[0] = '\0';
          if ((wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>._M_impl.
               super__Vector_impl_data._M_start)->name != (char *)0x0) {
            lVar6 = 0x10;
            pwVar8 = wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            do {
              iVar10 = pwVar8->level;
              iVar4 = get_trust(ch);
              pwVar2 = wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (iVar10 <= iVar4) {
                strcat(local_1238,
                       *(char **)((long)&wiznet_table.
                                         super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].name + lVar6)
                      );
                sVar9 = strlen(local_1238);
                (local_1238 + sVar9)[0] = ' ';
                (local_1238 + sVar9)[1] = '\0';
              }
              pwVar8 = (pointer)((long)&pwVar2->name + lVar6);
              plVar1 = (long *)((long)&pwVar2->name + lVar6);
              lVar6 = lVar6 + 0x10;
            } while (*plVar1 != 0);
          }
          sVar9 = strlen(local_1238);
          (local_1238 + sVar9)[0] = '\n';
          (local_1238 + sVar9)[1] = '\r';
          local_1238[sVar9 + 2] = '\0';
          txt = "Wiznet options available to you are:\n\r";
        }
        else {
          local_1238[0] = '\0';
          if ((ch->wiznet[0] & 1) == 0) {
            sVar9 = strlen(local_1238);
            builtin_strncpy(local_1238 + sVar9,"off ",5);
          }
          if ((wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>._M_impl.
               super__Vector_impl_data._M_start)->name != (char *)0x0) {
            lVar6 = 0x10;
            pwVar8 = wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            do {
              iVar10 = pwVar8->flag;
              iVar4 = iVar10 + 0x1f;
              if (-1 < iVar10) {
                iVar4 = iVar10;
              }
              uVar7 = ch->wiznet[iVar4 >> 5];
              dVar11 = ldexp(1.0,iVar10 % 0x20);
              pwVar2 = wiznet_table.super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if ((uVar7 & (long)dVar11) != 0) {
                strcat(local_1238,
                       *(char **)((long)&wiznet_table.
                                         super__Vector_base<wiznet_type,_std::allocator<wiznet_type>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].name + lVar6)
                      );
                sVar9 = strlen(local_1238);
                (local_1238 + sVar9)[0] = ' ';
                (local_1238 + sVar9)[1] = '\0';
              }
              pwVar8 = (pointer)((long)&pwVar2->name + lVar6);
              plVar1 = (long *)((long)&pwVar2->name + lVar6);
              lVar6 = lVar6 + 0x10;
            } while (*plVar1 != 0);
          }
          sVar9 = strlen(local_1238);
          (local_1238 + sVar9)[0] = '\n';
          (local_1238 + sVar9)[1] = '\r';
          local_1238[sVar9 + 2] = '\0';
          txt = "Wiznet status:\n\r";
        }
        send_to_char(txt,ch);
        send_to_char(local_1238,ch);
      }
      else {
        send_to_char("Signing off of Wiznet.\n\r",ch);
        *(byte *)ch->wiznet = (byte)ch->wiznet[0] & 0xfe;
      }
    }
    else {
      send_to_char("Welcome to Wiznet!\n\r",ch);
      *(byte *)ch->wiznet = (byte)ch->wiznet[0] | 1;
    }
  }
  return;
}

Assistant:

void do_wiznet(CHAR_DATA *ch, char *argument)
{
	int flag;
	char buf[MAX_STRING_LENGTH];

	if (argument[0] == '\0')
	{
		if (IS_SET(ch->wiznet, WIZ_ON))
		{
			send_to_char("Signing off of Wiznet.\n\r", ch);
			REMOVE_BIT(ch->wiznet, WIZ_ON);
		}
		else
		{
			send_to_char("Welcome to Wiznet!\n\r", ch);
			SET_BIT(ch->wiznet, WIZ_ON);
		}

		return;
	}

	if (!str_prefix(argument, "on"))
	{
		send_to_char("Welcome to Wiznet!\n\r", ch);
		SET_BIT(ch->wiznet, WIZ_ON);
		return;
	}

	if (!str_prefix(argument, "off"))
	{
		send_to_char("Signing off of Wiznet.\n\r", ch);
		REMOVE_BIT(ch->wiznet, WIZ_ON);
		return;
	}

	/* show wiznet status */
	if (!str_prefix(argument, "status"))
	{
		buf[0] = '\0';

		if (!IS_SET(ch->wiznet, WIZ_ON))
			strcat(buf, "off ");

		for (flag = 0; wiznet_table[flag].name != nullptr; flag++)
		{
			if (IS_SET(ch->wiznet, wiznet_table[flag].flag))
			{
				strcat(buf, wiznet_table[flag].name);
				strcat(buf, " ");
			}
		}

		strcat(buf, "\n\r");

		send_to_char("Wiznet status:\n\r", ch);
		send_to_char(buf, ch);
		return;
	}

	/* list of all wiznet options */
	if (!str_prefix(argument, "show"))
	{
		buf[0] = '\0';

		for (flag = 0; wiznet_table[flag].name != nullptr; flag++)
		{
			if (wiznet_table[flag].level <= get_trust(ch))
			{
				strcat(buf, wiznet_table[flag].name);
				strcat(buf, " ");
			}
		}

		strcat(buf, "\n\r");

		send_to_char("Wiznet options available to you are:\n\r", ch);
		send_to_char(buf, ch);
		return;
	}

	flag = wiznet_lookup(argument);

	if (flag == -1 || get_trust(ch) < wiznet_table[flag].level)
	{
		send_to_char("No such option.\n\r", ch);
		return;
	}

	if (IS_SET(ch->wiznet, wiznet_table[flag].flag))
	{
		sprintf(buf, "You will no longer see %s on wiznet.\n\r", wiznet_table[flag].name);
		send_to_char(buf, ch);

		REMOVE_BIT(ch->wiznet, wiznet_table[flag].flag);
	}
	else
	{
		sprintf(buf, "You will now see %s on wiznet.\n\r", wiznet_table[flag].name);
		send_to_char(buf, ch);

		SET_BIT(ch->wiznet, wiznet_table[flag].flag);
	}
}